

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O1

void dr_prediction_z1_64xN_sse4_1
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  undefined1 uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ushort uVar13;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  undefined1 auVar14 [16];
  ushort uVar23;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar26 [16];
  short sVar27;
  short sVar28;
  ushort uVar29;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  undefined1 in_XMM8 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ushort uVar38;
  undefined1 in_XMM10 [16];
  undefined1 auVar39 [16];
  
  if (0 < N) {
    uVar5 = (long)N + 0x3f;
    auVar24 = pshufb(ZEXT116(above[(long)N + 0x3f]),(undefined1  [16])0x0);
    uVar4 = (uint)uVar5;
    auVar25 = pshufb(ZEXT416(uVar4),(undefined1  [16])0x0);
    iVar9 = 0;
    auVar26 = pmovsxbw(in_XMM4,0x1010101010101010);
    iVar10 = N;
    uVar6 = upsample_above;
    do {
      iVar7 = (int)uVar6 >> 6;
      iVar3 = iVar10;
      if (iVar7 < (int)uVar4) {
        auVar14 = ZEXT416(uVar6 >> 1 & 0x1f);
        auVar14 = pshuflw(auVar14,auVar14,0);
        lVar12 = (long)iVar7;
        uVar11 = 0xfffffffffffffff0;
        do {
          auVar15 = auVar24;
          if ((long)(lVar12 + uVar11 + 0x10) < (long)(uVar5 & 0xffffffff)) {
            auVar15 = *(undefined1 (*) [16])(above + uVar11 + lVar12 + 0x10);
            auVar16 = *(undefined1 (*) [16])(above + uVar11 + lVar12 + 0x11);
            auVar30 = pmovzxbw(in_XMM8,auVar15);
            auVar39 = pmovzxbw(in_XMM10,auVar16);
            auVar31 = psllw(auVar30,5);
            sVar27 = auVar14._0_2_;
            sVar28 = auVar14._2_2_;
            uVar29 = (ushort)(auVar31._0_2_ + auVar26._0_2_ +
                             (auVar39._0_2_ - auVar30._0_2_) * sVar27) >> 5;
            uVar32 = (ushort)(auVar31._2_2_ + auVar26._2_2_ +
                             (auVar39._2_2_ - auVar30._2_2_) * sVar28) >> 5;
            uVar33 = (ushort)(auVar31._4_2_ + auVar26._4_2_ +
                             (auVar39._4_2_ - auVar30._4_2_) * sVar27) >> 5;
            uVar34 = (ushort)(auVar31._6_2_ + auVar26._6_2_ +
                             (auVar39._6_2_ - auVar30._6_2_) * sVar28) >> 5;
            uVar35 = (ushort)(auVar31._8_2_ + auVar26._8_2_ +
                             (auVar39._8_2_ - auVar30._8_2_) * sVar27) >> 5;
            uVar36 = (ushort)(auVar31._10_2_ + auVar26._10_2_ +
                             (auVar39._10_2_ - auVar30._10_2_) * sVar28) >> 5;
            uVar37 = (ushort)(auVar31._12_2_ + auVar26._12_2_ +
                             (auVar39._12_2_ - auVar30._12_2_) * sVar27) >> 5;
            uVar38 = (ushort)(auVar31._14_2_ + auVar26._14_2_ +
                             (auVar39._14_2_ - auVar30._14_2_) * sVar28) >> 5;
            auVar30._0_2_ = CONCAT11(0,auVar15[8]);
            auVar30[2] = auVar15[9];
            auVar30[3] = 0;
            auVar30[4] = auVar15[10];
            auVar30[5] = 0;
            auVar30[6] = auVar15[0xb];
            auVar30[7] = 0;
            auVar30[8] = auVar15[0xc];
            auVar30[9] = 0;
            auVar30[10] = auVar15[0xd];
            auVar30[0xb] = 0;
            auVar30[0xc] = auVar15[0xe];
            auVar30[0xd] = 0;
            auVar30[0xe] = auVar15[0xf];
            auVar30[0xf] = 0;
            auVar31 = psllw(auVar30,5);
            uVar13 = (ushort)(auVar31._0_2_ + auVar26._0_2_ + (auVar16[8] - auVar30._0_2_) * sVar27)
                     >> 5;
            uVar17 = (ushort)(auVar31._2_2_ + auVar26._2_2_ +
                             ((ushort)auVar16[9] - (ushort)auVar15[9]) * sVar28) >> 5;
            uVar18 = (ushort)(auVar31._4_2_ + auVar26._4_2_ +
                             ((ushort)auVar16[10] - (ushort)auVar15[10]) * sVar27) >> 5;
            uVar19 = (ushort)(auVar31._6_2_ + auVar26._6_2_ +
                             ((ushort)auVar16[0xb] - (ushort)auVar15[0xb]) * sVar28) >> 5;
            uVar20 = (ushort)(auVar31._8_2_ + auVar26._8_2_ +
                             ((ushort)auVar16[0xc] - (ushort)auVar15[0xc]) * sVar27) >> 5;
            uVar21 = (ushort)(auVar31._10_2_ + auVar26._10_2_ +
                             ((ushort)auVar16[0xd] - (ushort)auVar15[0xd]) * sVar28) >> 5;
            uVar22 = (ushort)(auVar31._12_2_ + auVar26._12_2_ +
                             ((ushort)auVar16[0xe] - (ushort)auVar15[0xe]) * sVar27) >> 5;
            uVar23 = (ushort)(auVar31._14_2_ + auVar26._14_2_ +
                             ((ushort)auVar16[0xf] - (ushort)auVar15[0xf]) * sVar28) >> 5;
            in_XMM8[1] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
            in_XMM8[0] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
            in_XMM8[2] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
            in_XMM8[3] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
            in_XMM8[4] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
            in_XMM8[5] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
            in_XMM8[6] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
            in_XMM8[7] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
            in_XMM8[8] = (uVar13 != 0) * (uVar13 < 0x100) * (char)uVar13 - (0xff < uVar13);
            in_XMM8[9] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
            in_XMM8[10] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
            in_XMM8[0xb] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
            in_XMM8[0xc] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
            in_XMM8[0xd] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
            in_XMM8[0xe] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
            in_XMM8[0xf] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
            iVar3 = iVar7 + (int)uVar11;
            uVar1 = iVar3 + 0x10;
            uVar8 = (undefined1)uVar1;
            auVar15 = ZEXT216(CONCAT11(uVar8,uVar8));
            auVar15 = pshuflw(auVar15,auVar15,0);
            in_XMM10._0_4_ =
                 CONCAT13(auVar15[3] + '\a',
                          CONCAT12(auVar15[2] + '\x06',
                                   CONCAT11(auVar15[1] + '\x05',auVar15[0] + '\x04')));
            in_XMM10[4] = auVar15[4];
            in_XMM10[5] = auVar15[5];
            in_XMM10[6] = auVar15[6];
            in_XMM10[7] = auVar15[7];
            in_XMM10[8] = auVar15[8];
            in_XMM10[9] = auVar15[9];
            in_XMM10[10] = auVar15[10];
            in_XMM10[0xb] = auVar15[0xb];
            in_XMM10[0xc] = auVar15[0xc];
            in_XMM10[0xd] = auVar15[0xd];
            in_XMM10[0xe] = auVar15[0xe];
            in_XMM10[0xf] = auVar15[0xf];
            auVar31[9] = auVar15[1] + '\t';
            auVar31[8] = auVar15[0] + '\b';
            auVar31[10] = auVar15[2] + '\n';
            auVar31[0xb] = auVar15[3] + '\v';
            auVar31[0xc] = in_XMM10[4] + '\f';
            auVar31[0xd] = in_XMM10[5] + '\r';
            auVar31[0xe] = in_XMM10[6] + '\x0e';
            auVar31[0xf] = in_XMM10[7] + '\x0f';
            cVar2 = (char)iVar3;
            auVar31._4_4_ = in_XMM10._0_4_;
            auVar31._0_4_ =
                 uVar1 & 0xff | (uint)(byte)(cVar2 + 0x11) << 8 | (uint)(byte)(cVar2 + 0x12) << 0x10
                 | (uint)(byte)(cVar2 + 0x13) << 0x18;
            auVar15 = psubusb(auVar25,auVar31);
            auVar16[0] = -('\0' < auVar15[0]);
            auVar16[1] = -('\0' < auVar15[1]);
            auVar16[2] = -('\0' < auVar15[2]);
            auVar16[3] = -('\0' < auVar15[3]);
            auVar16[4] = -('\0' < auVar15[4]);
            auVar16[5] = -('\0' < auVar15[5]);
            auVar16[6] = -('\0' < auVar15[6]);
            auVar16[7] = -('\0' < auVar15[7]);
            auVar16[8] = -('\0' < auVar15[8]);
            auVar16[9] = -('\0' < auVar15[9]);
            auVar16[10] = -('\0' < auVar15[10]);
            auVar16[0xb] = -('\0' < auVar15[0xb]);
            auVar16[0xc] = -('\0' < auVar15[0xc]);
            auVar16[0xd] = -('\0' < auVar15[0xd]);
            auVar16[0xe] = -('\0' < auVar15[0xe]);
            auVar16[0xf] = -('\0' < auVar15[0xf]);
            auVar15 = pblendvb(auVar24,in_XMM8,auVar16);
          }
          *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)dst + 0x10) + uVar11) = auVar15;
          uVar11 = uVar11 + 0x10;
        } while (uVar11 < 0x30);
        uVar6 = uVar6 + upsample_above;
      }
      else {
        do {
          *(undefined1 (*) [16])dst = auVar24;
          *(undefined1 (*) [16])((long)dst + 0x10) = auVar24;
          *(undefined1 (*) [16])((long)dst + 0x20) = auVar24;
          *(undefined1 (*) [16])((long)dst + 0x30) = auVar24;
          dst = *(undefined1 (*) [16])dst + stride;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      if ((int)uVar4 <= iVar7) {
        return;
      }
      iVar9 = iVar9 + 1;
      dst = *(undefined1 (*) [16])dst + stride;
      iVar10 = iVar10 + -1;
    } while (iVar9 < N);
  }
  return;
}

Assistant:

static void dr_prediction_z1_64xN_sse4_1(int N, uint8_t *dst, ptrdiff_t stride,
                                         const uint8_t *above,
                                         int upsample_above, int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m128i a0, a1, a32, a16;
  __m128i a_mbase_x, diff, c3f;
  __m128i max_base, base_inc, mask;

  a16 = _mm_set1_epi16(16);
  a_mbase_x = _mm_set1_epi8((char)above[max_base_x]);
  max_base = _mm_set1_epi8(max_base_x);
  c3f = _mm_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m128i b, res, res1;
    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm_storeu_si128((__m128i *)dst, a_mbase_x);  // save 32 values
        _mm_storeu_si128((__m128i *)(dst + 16), a_mbase_x);
        _mm_storeu_si128((__m128i *)(dst + 32), a_mbase_x);
        _mm_storeu_si128((__m128i *)(dst + 48), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m128i shift =
        _mm_srli_epi16(_mm_and_si128(_mm_set1_epi16(x), c3f), 1);  // 8 element

    __m128i a0_above, a1_above, res_val;
    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm_storeu_si128((__m128i *)(dst + j), a_mbase_x);
      } else {
        a0_above =
            _mm_loadu_si128((__m128i *)(above + base + j));  // load 16 element
        a1_above = _mm_loadu_si128((__m128i *)(above + base + 1 + j));

        // lower half
        a0 = _mm_cvtepu8_epi16(a0_above);
        a1 = _mm_cvtepu8_epi16(a1_above);

        diff = _mm_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm_mullo_epi16(diff, shift);

        res = _mm_add_epi16(a32, b);
        res = _mm_srli_epi16(res, 5);

        // uppar half
        a0 = _mm_cvtepu8_epi16(_mm_srli_si128(a0_above, 8));
        a1 = _mm_cvtepu8_epi16(_mm_srli_si128(a1_above, 8));

        diff = _mm_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm_add_epi16(a32, a16);  // a[x] * 32 + 16

        b = _mm_mullo_epi16(diff, shift);
        res1 = _mm_add_epi16(a32, b);
        res1 = _mm_srli_epi16(res1, 5);

        res = _mm_packus_epi16(res, res1);  // 16 8bit values

        base_inc =
            _mm_setr_epi8((int8_t)(base + j), (int8_t)(base + j + 1),
                          (int8_t)(base + j + 2), (int8_t)(base + j + 3),
                          (int8_t)(base + j + 4), (int8_t)(base + j + 5),
                          (int8_t)(base + j + 6), (int8_t)(base + j + 7),
                          (int8_t)(base + j + 8), (int8_t)(base + j + 9),
                          (int8_t)(base + j + 10), (int8_t)(base + j + 11),
                          (int8_t)(base + j + 12), (int8_t)(base + j + 13),
                          (int8_t)(base + j + 14), (int8_t)(base + j + 15));

        mask = _mm_cmpgt_epi8(_mm_subs_epu8(max_base, base_inc),
                              _mm_setzero_si128());
        res_val = _mm_blendv_epi8(a_mbase_x, res, mask);
        _mm_storeu_si128((__m128i *)(dst + j), res_val);
      }
    }
    x += dx;
  }
}